

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

MockSpec<int_(int,_int,_int,_int,_int,_int,_int,_int)> * __thiscall
testing::internal::FunctionMocker<int_(int,_int,_int,_int,_int,_int,_int,_int)>::With
          (MockSpec<int_(int,_int,_int,_int,_int,_int,_int,_int)> *__return_storage_ptr__,
          FunctionMocker<int_(int,_int,_int,_int,_int,_int,_int,_int)> *this,Matcher<int> *m,
          Matcher<int> *m_1,Matcher<int> *m_2,Matcher<int> *m_3,Matcher<int> *m_4,Matcher<int> *m_5,
          Matcher<int> *m_6,Matcher<int> *m_7)

{
  tuple<testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
  local_100;
  Matcher<int> *local_40;
  Matcher<int> *m_local_3;
  Matcher<int> *m_local_2;
  Matcher<int> *m_local_1;
  Matcher<int> *m_local;
  FunctionMocker<int_(int,_int,_int,_int,_int,_int,_int,_int)> *this_local;
  
  local_40 = m_3;
  m_local_3 = m_2;
  m_local_2 = m_1;
  m_local_1 = m;
  m_local = (Matcher<int> *)this;
  this_local = (FunctionMocker<int_(int,_int,_int,_int,_int,_int,_int,_int)> *)
               __return_storage_ptr__;
  std::
  make_tuple<testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>>
            (&local_100,m,m_1,m_2,m_3,m_4,m_5,m_6,m_7);
  MockSpec<int_(int,_int,_int,_int,_int,_int,_int,_int)>::MockSpec
            (__return_storage_ptr__,this,&local_100);
  std::
  tuple<testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
  ::~tuple(&local_100);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }